

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O0

void __thiscall QProgressStyleAnimation::~QProgressStyleAnimation(QProgressStyleAnimation *this)

{
  void *in_RDI;
  
  ~QProgressStyleAnimation((QProgressStyleAnimation *)0x4c790c);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QProgressStyleAnimation : public QStyleAnimation
{
    Q_OBJECT

public:
    QProgressStyleAnimation(int speed, QObject *target);

    int animationStep() const;
    int progressStep(int width) const;

    int speed() const;
    void setSpeed(int speed);

protected:
    bool isUpdateNeeded() const override;

private:
    int _speed;
    mutable int _step;
}